

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O0

void __thiscall
duckdb_shell::ModeLatexRenderer::RenderHeader(ModeLatexRenderer *this,ColumnarResult *result)

{
  bool bVar1;
  ColumnRenderer *in_RSI;
  long *in_RDI;
  idx_t i_1;
  idx_t i;
  ShellState *in_stack_ffffffffffffffb8;
  ShellState *in_stack_ffffffffffffffc0;
  _func_int **i_00;
  ColumnarResult *result_00;
  
  ShellState::Print(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  for (result_00 = (ColumnarResult *)0x0;
      result_00 < (ColumnarResult *)(in_RSI->super_ShellRenderer)._vptr_ShellRenderer;
      result_00 = (ColumnarResult *)((long)&result_00->column_count + 1)) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               &in_RSI[1].super_ShellRenderer.col_sep._M_string_length,(size_type)result_00);
    bVar1 = ShellState::ColumnTypeIsInteger(in_stack_ffffffffffffffb8,(char *)0x1ed19e);
    if (bVar1) {
      ShellState::Print(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
    }
    else {
      ShellState::Print(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
    }
  }
  ShellState::Print(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  ShellState::Print(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  for (i_00 = (_func_int **)0x0; i_00 < (in_RSI->super_ShellRenderer)._vptr_ShellRenderer;
      i_00 = (_func_int **)((long)i_00 + 1)) {
    ColumnRenderer::RenderAlignedValue(in_RSI,result_00,(idx_t)i_00);
    if (i_00 == (_func_int **)((long)(in_RSI->super_ShellRenderer)._vptr_ShellRenderer - 1U)) {
      in_stack_ffffffffffffffc0 = (ShellState *)(**(code **)(*in_RDI + 0x28))();
    }
    else {
      in_stack_ffffffffffffffc0 = (ShellState *)(**(code **)(*in_RDI + 0x20))();
    }
    ShellState::Print(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  }
  ShellState::Print(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void RenderHeader(ColumnarResult &result) override {
		state.Print("\\begin{tabular}{|");
		for (idx_t i = 0; i < result.column_count; i++) {
			if (state.ColumnTypeIsInteger(result.type_names[i])) {
				state.Print("r");
			} else {
				state.Print("l");
			}
		}
		state.Print("|}\n");
		state.Print("\\hline\n");
		for (idx_t i = 0; i < result.column_count; i++) {
			RenderAlignedValue(result, i);
			state.Print(i == result.column_count - 1 ? GetRowSeparator() : GetColumnSeparator());
		}
		state.Print("\\hline\n");
	}